

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

__m128i x_convolve_4tap_2x2_ssse3(uint8_t *src,ptrdiff_t stride,__m128i *coeffs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  __m128i *in_RDX;
  undefined8 uVar5;
  undefined8 uVar6;
  __m128i alVar7;
  __m128i ss [2];
  __m128i s;
  __m128i sfl1;
  __m128i sfl0;
  ptrdiff_t in_stack_fffffffffffffea8;
  uint in_stack_fffffffffffffeb0;
  __m128i local_148;
  undefined1 local_138 [16];
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  __m128i *local_f0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98;
  undefined1 local_97;
  undefined1 local_96;
  undefined1 local_95;
  undefined1 local_94;
  undefined1 local_93;
  undefined1 local_92;
  undefined1 local_91;
  undefined1 local_90;
  undefined1 local_8f;
  undefined1 local_8e;
  undefined1 local_8d;
  undefined1 local_8c;
  undefined1 local_8b;
  undefined1 local_8a;
  undefined1 local_89;
  undefined1 local_88;
  undefined1 local_87;
  undefined1 local_86;
  undefined1 local_85;
  undefined1 local_84;
  undefined1 local_83;
  undefined1 local_82;
  undefined1 local_81;
  undefined1 local_80;
  undefined1 local_7f;
  undefined1 local_7e;
  undefined1 local_7d;
  undefined1 local_7c;
  undefined1 local_7b;
  undefined1 local_7a;
  undefined1 local_79;
  undefined1 local_78 [16];
  undefined1 local_68;
  undefined1 local_67;
  undefined1 local_66;
  undefined1 local_65;
  undefined1 local_64;
  undefined1 local_63;
  undefined1 local_62;
  undefined1 local_61;
  undefined1 local_60;
  undefined1 local_5f;
  undefined1 local_5e;
  undefined1 local_5d;
  undefined1 local_5c;
  undefined1 local_5b;
  undefined1 local_5a;
  undefined1 local_59;
  undefined1 local_58 [16];
  undefined1 local_40;
  undefined1 local_3f;
  undefined1 local_3e;
  undefined1 local_3d;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  
  local_79 = 0;
  local_7a = 1;
  local_7b = 1;
  local_7c = 2;
  local_7d = 8;
  local_7e = 9;
  local_7f = 9;
  local_80 = 10;
  local_81 = 0;
  local_82 = 0;
  local_83 = 0;
  local_84 = 0;
  local_85 = 0;
  local_86 = 0;
  local_87 = 0;
  local_88 = 0;
  local_59 = 0;
  local_5a = 0;
  local_5b = 0;
  local_5c = 0;
  local_5d = 0;
  local_5e = 0;
  local_5f = 0;
  local_60 = 0;
  local_61 = 10;
  local_62 = 9;
  local_63 = 9;
  local_64 = 8;
  local_65 = 2;
  local_66 = 1;
  local_67 = 1;
  local_68 = 0;
  auVar1 = vpinsrb_avx(ZEXT116(0),1,1);
  auVar1 = vpinsrb_avx(auVar1,1,2);
  auVar1 = vpinsrb_avx(auVar1,2,3);
  auVar1 = vpinsrb_avx(auVar1,8,4);
  auVar1 = vpinsrb_avx(auVar1,9,5);
  auVar1 = vpinsrb_avx(auVar1,9,6);
  auVar1 = vpinsrb_avx(auVar1,10,7);
  auVar1 = vpinsrb_avx(auVar1,0,8);
  auVar1 = vpinsrb_avx(auVar1,0,9);
  auVar1 = vpinsrb_avx(auVar1,0,10);
  auVar1 = vpinsrb_avx(auVar1,0,0xb);
  auVar1 = vpinsrb_avx(auVar1,0,0xc);
  auVar1 = vpinsrb_avx(auVar1,0,0xd);
  auVar1 = vpinsrb_avx(auVar1,0,0xe);
  local_78 = vpinsrb_avx(auVar1,0,0xf);
  local_108 = local_78._0_8_;
  uStack_100 = local_78._8_8_;
  local_89 = 2;
  local_8a = 3;
  local_8b = 3;
  local_8c = 4;
  local_8d = 10;
  local_8e = 0xb;
  local_8f = 0xb;
  local_90 = 0xc;
  local_91 = 0;
  local_92 = 0;
  local_93 = 0;
  local_94 = 0;
  local_95 = 0;
  local_96 = 0;
  local_97 = 0;
  local_98 = 0;
  local_31 = 0;
  local_32 = 0;
  local_33 = 0;
  local_34 = 0;
  local_35 = 0;
  local_36 = 0;
  local_37 = 0;
  local_38 = 0;
  local_39 = 0xc;
  local_3a = 0xb;
  local_3b = 0xb;
  local_3c = 10;
  local_3d = 4;
  local_3e = 3;
  local_3f = 3;
  local_40 = 2;
  auVar1 = vpinsrb_avx(ZEXT116(2),3,1);
  auVar1 = vpinsrb_avx(auVar1,3,2);
  auVar1 = vpinsrb_avx(auVar1,4,3);
  auVar1 = vpinsrb_avx(auVar1,10,4);
  auVar1 = vpinsrb_avx(auVar1,0xb,5);
  auVar1 = vpinsrb_avx(auVar1,0xb,6);
  auVar1 = vpinsrb_avx(auVar1,0xc,7);
  auVar1 = vpinsrb_avx(auVar1,0,8);
  auVar1 = vpinsrb_avx(auVar1,0,9);
  auVar1 = vpinsrb_avx(auVar1,0,10);
  auVar1 = vpinsrb_avx(auVar1,0,0xb);
  auVar1 = vpinsrb_avx(auVar1,0,0xc);
  auVar1 = vpinsrb_avx(auVar1,0,0xd);
  auVar1 = vpinsrb_avx(auVar1,0,0xe);
  local_58 = vpinsrb_avx(auVar1,0,0xf);
  local_118 = local_58._0_8_;
  uStack_110 = local_58._8_8_;
  uVar5 = local_58._0_8_;
  uVar6 = local_58._8_8_;
  local_f0 = in_RDX;
  load_u8_8x2_sse2((uint8_t *)CONCAT17(2,(uint7)in_stack_fffffffffffffeb0),in_stack_fffffffffffffea8
                  );
  local_b8 = local_108;
  uStack_b0 = uStack_100;
  auVar4._8_8_ = uVar6;
  auVar4._0_8_ = uVar5;
  auVar3._8_8_ = uStack_100;
  auVar3._0_8_ = local_108;
  local_148 = (__m128i)vpshufb_avx(auVar4,auVar3);
  local_d8 = local_118;
  uStack_d0 = uStack_110;
  auVar2._8_8_ = uVar6;
  auVar2._0_8_ = uVar5;
  auVar1._8_8_ = uStack_110;
  auVar1._0_8_ = local_118;
  local_138 = vpshufb_avx(auVar2,auVar1);
  local_128 = uVar5;
  uStack_120 = uVar6;
  local_c8 = uVar5;
  uStack_c0 = uVar6;
  local_a8 = uVar5;
  uStack_a0 = uVar6;
  alVar7 = convolve_4tap_ssse3(&local_148,local_f0);
  alVar7[0] = alVar7[0];
  alVar7[1] = alVar7[1];
  return alVar7;
}

Assistant:

static inline __m128i x_convolve_4tap_2x2_ssse3(const uint8_t *const src,
                                                const ptrdiff_t stride,
                                                const __m128i coeffs[2]) {
  const __m128i sfl0 =
      _mm_setr_epi8(0, 1, 1, 2, 8, 9, 9, 10, 0, 0, 0, 0, 0, 0, 0, 0);
  const __m128i sfl1 =
      _mm_setr_epi8(2, 3, 3, 4, 10, 11, 11, 12, 0, 0, 0, 0, 0, 0, 0, 0);
  const __m128i s = load_u8_8x2_sse2(src, stride);
  __m128i ss[2];

  ss[0] = _mm_shuffle_epi8(s, sfl0);
  ss[1] = _mm_shuffle_epi8(s, sfl1);
  return convolve_4tap_ssse3(ss, coeffs);
}